

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pw91_lda_mod.hpp
# Opt level: O1

void ExchCXX::kernel_traits<ExchCXX::BuiltinPW91_LDA_MOD>::eval_exc_polar_impl
               (double rho_a,double rho_b,double *eps)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double __x_00;
  
  __x = rho_a + rho_b;
  dVar1 = cbrt(__x);
  dVar7 = (1.0 / dVar1) * 1.720508027656199;
  dVar8 = (1.0 / dVar1) * 2.4814019635975995;
  dVar11 = SQRT(dVar8);
  dVar1 = dVar11;
  if (dVar8 < 0.0) {
    dVar1 = sqrt(dVar8);
  }
  if (dVar8 < 0.0) {
    dVar11 = sqrt(dVar8);
  }
  dVar11 = dVar11 * dVar11 * dVar11;
  dVar9 = dVar8 * 0.25 * dVar8 * 0.25;
  dVar8 = log((32.16395899738507 /
              (dVar11 * 0.204775 + dVar7 * 5.1742145584348584 * 0.25 + dVar1 * 7.5957 * 0.5 +
              dVar9 * 0.49294)) * 0.5 + 1.0);
  dVar8 = (dVar7 * 0.30820873317469316 * 0.25 + 1.0) * 0.0310907 * dVar8;
  dVar10 = rho_a - rho_b;
  dVar12 = (1.0 / __x) * dVar10;
  __x_00 = dVar12 + 1.0;
  dVar2 = cbrt(1e-15);
  dVar3 = cbrt(__x_00);
  dVar12 = 1.0 - dVar12;
  dVar4 = cbrt(dVar12);
  dVar5 = log((64.32791799477015 /
              (dVar11 * 0.420775 + dVar7 * 8.938630161894224 * 0.25 + dVar1 * 14.1189 * 0.5 +
              dVar9 * 0.62517)) * 0.5 + 1.0);
  dVar6 = dVar7 * 0.16045026469669918 * 0.25 + 1.0;
  dVar1 = log((59.217499955586874 /
              (dVar11 * 0.1100325 + dVar7 * 5.225414418180771 * 0.25 + dVar1 * 10.357 * 0.5 +
              dVar9 * 0.49671)) * 0.5 + 1.0);
  dVar8 = dVar8 + dVar8;
  dVar11 = ((double)(-(ulong)(dVar12 <= 1e-15) & (ulong)(dVar2 * 1e-15) |
                    ~-(ulong)(dVar12 <= 1e-15) & (ulong)(dVar4 * dVar12)) +
            (double)(-(ulong)(__x_00 <= 1e-15) & (ulong)(dVar2 * 1e-15) |
                    ~-(ulong)(__x_00 <= 1e-15) & (ulong)(dVar3 * __x_00)) + -2.0) *
           1.9236610509315362;
  *eps = (((dVar7 * 0.29635344170676625 * 0.25 + 1.0) * -0.0310907 * dVar5 +
           dVar6 * -0.0337738 * dVar1 * 0.5848223622634646 + dVar8) * dVar11 *
          (1.0 / (__x * __x * __x * __x)) * dVar10 * dVar10 * dVar10 * dVar10 - dVar8) +
         (dVar11 + dVar11) * 0.0168869 * dVar1 * dVar6 * 0.5848223622634646;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double& eps ) {

    (void)(eps);
    constexpr double t3 = constants::m_cbrt_3;
    constexpr double t6 = constants::m_cbrt_one_ov_pi;
    constexpr double t7 = constants::m_cbrt_4;
    constexpr double t70 = constants::m_cbrt_2;
    constexpr double t1 = a_0;
    constexpr double t2 = alpha1_0;
    constexpr double t4 = t2 * t3;
    constexpr double t8 = t7 * t7;
    constexpr double t9 = t6 * t8;
    constexpr double t18 = 0.1e1 / t1;
    constexpr double t19 = beta1_0;
    constexpr double t20 = t3 * t6;
    constexpr double t27 = beta2_0 * t3;
    constexpr double t30 = beta3_0;
    constexpr double t37 = pp_0 + 0.1e1;
    constexpr double t75 = a_1;
    constexpr double t76 = alpha1_1;
    constexpr double t77 = t76 * t3;
    constexpr double t82 = 0.1e1 / t75;
    constexpr double t83 = beta1_1;
    constexpr double t87 = beta2_1 * t3;
    constexpr double t90 = beta3_1;
    constexpr double t95 = pp_1 + 0.1e1;
    constexpr double t105 = a_2;
    constexpr double t106 = alpha1_2;
    constexpr double t107 = t106 * t3;
    constexpr double t112 = 0.1e1 / t105;
    constexpr double t113 = beta1_2;
    constexpr double t117 = beta2_2 * t3;
    constexpr double t120 = beta3_2;
    constexpr double t125 = pp_2 + 0.1e1;
    constexpr double t134 = 0.1e1 / fz20;


    const double t10 = rho_a + rho_b;
    const double t11 = safe_math::cbrt( t10 );
    const double t12 = 0.1e1 / t11;
    const double t13 = t9 * t12;
    const double t16 = 0.1e1 + t4 * t13 / 0.4e1;
    const double t22 = t20 * t8 * t12;
    const double t23 = safe_math::sqrt( t22 );
    const double t31 = pow_3_2( t22 );
    const double t35 = t22 / 0.4e1;
    const double t38 = safe_math::pow( t35, t37 );
    const double t39 = beta4_0 * t38;
    const double t40 = t19 * t23 / 0.2e1 + t27 * t13 / 0.4e1 + 0.125e0 * t30 * t31 + t39;
    const double t44 = 0.1e1 + t18 / t40 / 0.2e1;
    const double t45 = safe_math::log( t44 );
    const double t46 = t1 * t16 * t45;
    const double t47 = 0.2e1 * t46;
    const double t48 = rho_a - rho_b;
    const double t49 = t48 * t48;
    const double t50 = t49 * t49;
    const double t51 = t10 * t10;
    const double t52 = t51 * t51;
    const double t53 = 0.1e1 / t52;
    const double t54 = t50 * t53;
    const double t55 = 0.1e1 / t10;
    const double t56 = t48 * t55;
    const double t57 = 0.1e1 + t56;
    const double t58 = t57 <= zeta_tol;
    const double t59 = safe_math::cbrt( zeta_tol );
    const double t60 = t59 * zeta_tol;
    const double t61 = safe_math::cbrt( t57 );
    const double t63 = piecewise_functor_3( t58, t60, t61 * t57 );
    const double t64 = 0.1e1 - t56;
    const double t65 = t64 <= zeta_tol;
    const double t66 = safe_math::cbrt( t64 );
    const double t68 = piecewise_functor_3( t65, t60, t66 * t64 );
    const double t69 = t63 + t68 - 0.2e1;
    const double t73 = 0.1e1 / ( 0.2e1 * t70 - 0.2e1 );
    const double t74 = t69 * t73;
    const double t80 = 0.1e1 + t77 * t13 / 0.4e1;
    const double t96 = safe_math::pow( t35, t95 );
    const double t97 = beta4_1 * t96;
    const double t98 = t83 * t23 / 0.2e1 + t87 * t13 / 0.4e1 + 0.125e0 * t90 * t31 + t97;
    const double t102 = 0.1e1 + t82 / t98 / 0.2e1;
    const double t103 = safe_math::log( t102 );
    const double t110 = 0.1e1 + t107 * t13 / 0.4e1;
    const double t126 = safe_math::pow( t35, t125 );
    const double t127 = beta4_2 * t126;
    const double t128 = t113 * t23 / 0.2e1 + t117 * t13 / 0.4e1 + 0.125e0 * t120 * t31 + t127;
    const double t132 = 0.1e1 + t112 / t128 / 0.2e1;
    const double t133 = safe_math::log( t132 );
    const double t135 = t133 * t134;
    const double t138 = -0.2e1 * t75 * t80 * t103 - 0.2e1 * t105 * t110 * t135 + 0.2e1 * t46;
    const double t139 = t74 * t138;
    const double t140 = t54 * t139;
    const double t143 = t110 * t133 * t134;
    const double t145 = 0.2e1 * t74 * t105 * t143;


    eps = -t47 + t140 + t145;

  }